

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     outer_product_selector_run<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>const>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>const>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
               (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
                *dst,CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                     *lhs,Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *rhs,
               sub *func,false_type *param_5)

{
  undefined8 xpr;
  Scalar *ptr;
  ulong uVar1;
  long lVar2;
  Scalar *pSVar3;
  long i;
  PointerType scalar;
  Scalar SStack_158;
  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,_1,1,true>>
  local_150 [152];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>
  local_b8;
  undefined1 auStack_78 [8];
  ObjectType actual_lhs;
  undefined1 auStack_58 [8];
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>,__1,_true>
  actual_lhs_wrapper;
  
  pSVar3 = &SStack_158;
  uVar1 = (lhs->m_rhs).
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
          .m_rows.m_value * 8;
  if (uVar1 < 0x20001) {
    ptr = (Scalar *)((long)&SStack_158 - (uVar1 + 0x1e & 0xfffffffffffffff0));
    pSVar3 = ptr;
  }
  else {
    ptr = (Scalar *)0x0;
  }
  scalar = (rhs->
           super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           ).
           super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
  actual_lhs_wrapper._24_8_ = dst;
  pSVar3[-1] = 6.15352833107522e-318;
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>,_-1,_true>
  ::local_nested_eval_wrapper
            ((local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>,__1,_true>
              *)auStack_58,lhs,ptr);
  actual_lhs._8_1_ = actual_lhs_wrapper.object._8_1_;
  auStack_78 = auStack_58;
  actual_lhs._0_8_ = actual_lhs_wrapper.object._0_8_;
  i = 0;
  lVar2 = *(long *)(actual_lhs_wrapper._24_8_ + 0x10);
  if (*(long *)(actual_lhs_wrapper._24_8_ + 0x10) < 1) {
    lVar2 = i;
  }
  for (; xpr = actual_lhs_wrapper._24_8_, lVar2 != i; i = i + 1) {
    pSVar3[-1] = 6.15387417702731e-318;
    Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>
    ::Block((Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>
             *)local_150,
            (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
             *)xpr,i);
    pSVar3[-1] = 6.15394828687419e-318;
    Eigen::operator*(&local_b8,scalar,(StorageBaseType *)auStack_78);
    pSVar3[-1] = 6.15400263409523e-318;
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,-1,false>,-1,1,true>>
    ::operator-=(local_150,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>_>
                  *)&local_b8);
    scalar = scalar + 1;
  }
  pSVar3[-1] = 6.15409156591148e-318;
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>,_-1,_true>
  ::~local_nested_eval_wrapper
            ((local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>,__1,_true>
              *)auStack_58);
  return;
}

Assistant:

void EIGEN_DEVICE_FUNC outer_product_selector_run(Dst& dst, const Lhs &lhs, const Rhs &rhs, const Func& func, const false_type&)
{
  evaluator<Rhs> rhsEval(rhs);
  ei_declare_local_nested_eval(Lhs,lhs,Rhs::SizeAtCompileTime,actual_lhs);
  // FIXME if cols is large enough, then it might be useful to make sure that lhs is sequentially stored
  // FIXME not very good if rhs is real and lhs complex while alpha is real too
  const Index cols = dst.cols();
  for (Index j=0; j<cols; ++j)
    func(dst.col(j), rhsEval.coeff(Index(0),j) * actual_lhs);
}